

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O3

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong *puVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong *puVar29;
  ulong uVar30;
  ulong local_a0;
  
  if (dstCapacity < 9) {
    return 0xffffffffffffffba;
  }
  uVar4 = (ushort)*CTable_MatchLength;
  uVar17 = (ulong)mlCodeTable[nbSeq - 1];
  lVar8 = (long)(1 << ((char)uVar4 - 1U & 0x1f));
  if (uVar4 == 0) {
    lVar8 = 1;
  }
  uVar20 = CTable_MatchLength[lVar8 + uVar17 * 2 + 2] + 0x8000;
  uVar5 = *(ushort *)
           ((long)CTable_MatchLength +
           (long)(int)CTable_MatchLength[lVar8 + uVar17 * 2 + 1] * 2 +
           (ulong)((uVar20 & 0xffff0000) - CTable_MatchLength[lVar8 + uVar17 * 2 + 2] >>
                  ((byte)(uVar20 >> 0x10) & 0x3f)) * 2 + 4);
  bVar1 = ofCodeTable[nbSeq - 1];
  uVar26 = (ulong)bVar1;
  uVar6 = (ushort)*CTable_OffsetBits;
  lVar14 = (long)(1 << ((char)uVar6 - 1U & 0x1f));
  if (uVar6 == 0) {
    lVar14 = 1;
  }
  uVar20 = CTable_OffsetBits[lVar14 + uVar26 * 2 + 2] + 0x8000;
  uVar7 = (ushort)*CTable_LitLength;
  uVar16 = (ulong)*(ushort *)
                   ((long)CTable_OffsetBits +
                   (long)(int)CTable_OffsetBits[lVar14 + uVar26 * 2 + 1] * 2 +
                   (ulong)((uVar20 & 0xffff0000) - CTable_OffsetBits[lVar14 + uVar26 * 2 + 2] >>
                          ((byte)(uVar20 >> 0x10) & 0x3f)) * 2 + 4);
  lVar15 = (long)(1 << ((char)uVar7 - 1U & 0x1f));
  if (uVar7 == 0) {
    lVar15 = 1;
  }
  uVar9 = (ulong)llCodeTable[nbSeq - 1];
  uVar20 = CTable_LitLength[lVar15 + uVar9 * 2 + 2] + 0x8000;
  local_a0 = (ulong)*(ushort *)
                     ((long)CTable_LitLength +
                     (long)(int)CTable_LitLength[lVar15 + uVar9 * 2 + 1] * 2 +
                     (ulong)((uVar20 & 0xffff0000) - CTable_LitLength[lVar15 + uVar9 * 2 + 2] >>
                            ((byte)(uVar20 >> 0x10) & 0x3f)) * 2 + 4);
  bVar2 = ""[uVar9];
  iVar23 = (uint)bVar2 + (uint)""[uVar17];
  uVar17 = (ulong)((uint)sequences[nbSeq - 1].mlBase & BIT_mask[""[uVar17]]) << (bVar2 & 0x3f) |
           (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[bVar2]);
  puVar29 = (ulong *)((long)dst + (dstCapacity - 8));
  if ((longOffsets == 0) || (bVar1 < 0x38)) {
    if (bVar1 < 0x20) {
      uVar20 = iVar23 + (uint)bVar1;
      if (0x3f < uVar20) goto LAB_006fb7e4;
      if (puVar29 < dst) goto LAB_006fb7c5;
      uVar17 = (ulong)(sequences[nbSeq - 1].offBase & BIT_mask[uVar26]) << ((byte)iVar23 & 0x3f) |
               uVar17;
      puVar22 = (ulong *)((ulong)(uVar20 >> 3) + (long)dst);
      if (puVar29 < puVar22) {
        puVar22 = puVar29;
      }
      *(ulong *)dst = uVar17;
      uVar17 = uVar17 >> ((byte)uVar20 & 0x38);
      uVar20 = uVar20 & 7;
      if (1 < nbSeq) {
        uVar26 = nbSeq - 2;
        do {
          bVar1 = ofCodeTable[uVar26];
          uVar21 = (ulong)bVar1;
          uVar9 = CTable_OffsetBits[lVar14 + uVar21 * 2 + 2] + uVar16;
          if (0x1fffff < uVar9) goto LAB_006fb827;
          uVar27 = uVar20 + (int)(uVar9 >> 0x10);
          if (0x3f < uVar27) goto LAB_006fb7e4;
          uVar25 = (uint)uVar16;
          uVar30 = (ulong)mlCodeTable[uVar26];
          uVar10 = (ulong)CTable_MatchLength[lVar8 + uVar30 * 2 + 2] + (ulong)uVar5;
          if (0x1fffff < uVar10) goto LAB_006fb827;
          uVar24 = uVar27 + (int)(uVar10 >> 0x10);
          if (0x3f < uVar24) goto LAB_006fb7e4;
          uVar18 = (uint)uVar5;
          uVar11 = (ulong)llCodeTable[uVar26];
          uVar28 = CTable_LitLength[lVar15 + uVar11 * 2 + 2] + local_a0;
          if (0x1fffff < uVar28) goto LAB_006fb827;
          uVar19 = uVar24 + (int)(uVar28 >> 0x10);
          if (0x3f < uVar19) goto LAB_006fb7e4;
          uVar16 = (ulong)*(ushort *)
                           ((long)CTable_OffsetBits +
                           (long)(int)CTable_OffsetBits[lVar14 + uVar21 * 2 + 1] * 2 +
                           (uVar16 >> ((byte)(uVar9 >> 0x10) & 0x3f)) * 2 + 4);
          uVar5 = *(ushort *)
                   ((long)CTable_MatchLength +
                   (long)(int)CTable_MatchLength[lVar8 + uVar30 * 2 + 1] * 2 +
                   (ulong)(uVar5 >> ((byte)(uVar10 >> 0x10) & 0x3f)) * 2 + 4);
          uVar17 = (ulong)(BIT_mask[uVar9 >> 0x10] & uVar25) << (sbyte)uVar20 | uVar17 |
                   (ulong)(BIT_mask[uVar10 >> 0x10] & uVar18) << ((byte)uVar27 & 0x3f) |
                   (ulong)(BIT_mask[uVar28 >> 0x10] & (uint)local_a0) << ((byte)uVar24 & 0x3f);
          bVar2 = ""[uVar11];
          bVar3 = ""[uVar30];
          local_a0 = (ulong)*(ushort *)
                             ((long)CTable_LitLength +
                             (long)(int)CTable_LitLength[lVar15 + uVar11 * 2 + 1] * 2 +
                             (local_a0 >> ((byte)(uVar28 >> 0x10) & 0x3f)) * 2 + 4);
          uVar20 = (uint)bVar2 + (uint)bVar1 + (uint)bVar3;
          puVar12 = puVar22;
          if (0x1e < uVar20) {
            puVar12 = (ulong *)((ulong)(uVar19 >> 3) + (long)puVar22);
            if (puVar29 < puVar12) {
              puVar12 = puVar29;
            }
            *puVar22 = uVar17;
            uVar17 = uVar17 >> ((byte)uVar19 & 0x38);
            uVar19 = uVar19 & 7;
          }
          uVar27 = uVar19 + bVar2;
          if ((0x3f < uVar27) || (uVar25 = uVar27 + bVar3, 0x3f < uVar25)) goto LAB_006fb7e4;
          uVar17 = (ulong)((uint)sequences[uVar26].mlBase & BIT_mask[(uint)bVar3]) <<
                   ((byte)uVar27 & 0x3f) |
                   (ulong)((uint)sequences[uVar26].litLength & BIT_mask[(uint)bVar2]) <<
                   ((byte)uVar19 & 0x3f) | uVar17;
          if (0x38 < uVar20) {
            puVar22 = (ulong *)((ulong)(uVar25 >> 3) + (long)puVar12);
            if (puVar29 < puVar22) {
              puVar22 = puVar29;
            }
            *puVar12 = uVar17;
            uVar17 = uVar17 >> ((byte)uVar25 & 0x38);
            uVar25 = uVar25 & 7;
            puVar12 = puVar22;
          }
          if ((longOffsets != 0) && (0x37 < bVar1)) {
            if ((bVar1 == 0x38) || (uVar20 = bVar1 - 0x38, 0x1f < uVar20)) goto LAB_006fb827;
            if (0x3f < uVar25 + uVar20) goto LAB_006fb7e4;
            *puVar12 = (ulong)(sequences[uVar26].offBase & BIT_mask[uVar20]) <<
                       ((byte)uVar25 & 0x3f) | uVar17;
            goto LAB_006fb827;
          }
          if (0x1f < bVar1) goto LAB_006fb827;
          uVar20 = uVar25 + bVar1;
          if (0x3f < uVar20) goto LAB_006fb7e4;
          uVar17 = (ulong)(BIT_mask[uVar21] & sequences[uVar26].offBase) << ((byte)uVar25 & 0x3f) |
                   uVar17;
          puVar22 = (ulong *)((ulong)(uVar20 >> 3) + (long)puVar12);
          if (puVar29 < puVar22) {
            puVar22 = puVar29;
          }
          *puVar12 = uVar17;
          uVar17 = uVar17 >> ((byte)uVar20 & 0x38);
          uVar26 = uVar26 - 1;
          uVar20 = uVar20 & 7;
        } while (uVar26 < nbSeq);
      }
      if (uVar4 < 0x20) {
        uVar17 = (ulong)((uint)uVar5 & BIT_mask[uVar4]) << (sbyte)uVar20 | uVar17;
        *puVar22 = uVar17;
        if (uVar6 < 0x20) {
          uVar20 = uVar20 + uVar4;
          puVar22 = (ulong *)((long)puVar22 + (ulong)(uVar20 >> 3));
          if (puVar29 < puVar22) {
            puVar22 = puVar29;
          }
          uVar17 = (ulong)((uint)uVar16 & BIT_mask[uVar6]) << (sbyte)(uVar20 & 7) |
                   uVar17 >> ((byte)uVar20 & 0x38);
          *puVar22 = uVar17;
          if (uVar7 < 0x20) {
            uVar20 = (uVar20 & 7) + (uint)uVar6;
            puVar22 = (ulong *)((long)puVar22 + (ulong)(uVar20 >> 3));
            if (puVar29 < puVar22) {
              puVar22 = puVar29;
            }
            uVar27 = (uVar20 & 7) + (uint)uVar7;
            uVar17 = (ulong)((uint)local_a0 & BIT_mask[uVar7]) << (sbyte)(uVar20 & 7) |
                     uVar17 >> ((byte)uVar20 & 0x38);
            puVar12 = (ulong *)((ulong)(uVar27 >> 3) + (long)puVar22);
            if (puVar29 < puVar12) {
              puVar12 = puVar29;
            }
            *puVar22 = uVar17;
            uVar20 = (uVar27 & 7) + 1;
            *puVar12 = uVar17 >> ((byte)uVar27 & 0x38) | 1L << (uVar27 & 7);
            puVar12 = (ulong *)((ulong)(uVar20 >> 3) + (long)puVar12);
            if (puVar29 < puVar12) {
              puVar12 = puVar29;
            }
            if ((puVar12 < puVar29) &&
               (sVar13 = (long)puVar12 + ((ulong)((uVar20 & 7) != 0) - (long)dst), sVar13 != 0)) {
              return sVar13;
            }
            return 0xffffffffffffffba;
          }
        }
      }
    }
  }
  else if ((bVar1 != 0x38) && (uVar20 = bVar1 - 0x38, uVar20 < 0x20)) {
    if (0x3f < iVar23 + uVar20) {
LAB_006fb7e4:
      __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bitstream.h"
                    ,0xb9,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
    }
    if (puVar29 < dst) {
LAB_006fb7c5:
      __assert_fail("bitC->ptr <= bitC->endPtr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bitstream.h"
                    ,0xe1,"void BIT_flushBits(BIT_CStream_t *)");
    }
    *(ulong *)dst =
         (ulong)(sequences[nbSeq - 1].offBase & BIT_mask[uVar20]) << ((byte)iVar23 & 0x3f) | uVar17;
  }
LAB_006fb827:
  __assert_fail("nbBits < BIT_MASK_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bitstream.h"
                ,0xb8,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
    DEBUGLOG(5, "ZSTD_encodeSequences: dstCapacity = %u", (unsigned)dstCapacity);
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}